

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O3

void Cmd_RunAutoTuner(char *pConfig,char *pFileList,int nCores)

{
  satoko_opts_t *pOpts;
  void **__ptr;
  int iVar1;
  uint uVar2;
  Vec_Wec_t *vPars;
  Vec_Ptr_t *__ptr_00;
  Vec_Ptr_t *__ptr_01;
  long lVar3;
  void *pvVar4;
  Vec_Int_t *__ptr_02;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  timespec ts;
  timespec local_70;
  Vec_Ptr_t *local_60;
  int local_54;
  long local_50;
  Vec_Wec_t *local_48;
  void *local_40;
  Vec_Ptr_t *local_38;
  
  local_54 = nCores;
  iVar1 = clock_gettime(3,&local_70);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  vPars = Cmd_ReadParamChoices(pConfig);
  __ptr_00 = Cmd_ReadFiles(pFileList);
  if (vPars != (Vec_Wec_t *)0x0) {
    __ptr_01 = Cmf_CreateOptions(vPars);
    if (__ptr_01 != (Vec_Ptr_t *)0x0 && __ptr_00 != (Vec_Ptr_t *)0x0) {
      local_60 = __ptr_00;
      local_50 = lVar3;
      local_48 = vPars;
      if (__ptr_01->nSize < 2) {
        uVar7 = 0x7fffffff;
        pvVar4 = (void *)0x0;
      }
      else {
        lVar3 = 1;
        pvVar4 = (void *)0x0;
        uVar6 = 0x7fffffff;
        local_38 = __ptr_01;
        do {
          pOpts = (satoko_opts_t *)local_38->pArray[lVar3 + -1];
          local_40 = local_38->pArray[lVar3];
          iVar1 = clock_gettime(3,&local_70);
          lVar5 = 1;
          if (-1 < iVar1) {
            lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
            lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_70.tv_sec * -1000000;
          }
          printf("Evaluating settings: %20s...  \n",local_40);
          uVar2 = Cmd_RunAutoTunerEval(local_60,pOpts,local_54);
          printf("Cost = %6d.  ",(ulong)uVar2);
          iVar1 = clock_gettime(3,&local_70);
          if (iVar1 < 0) {
            lVar8 = -1;
          }
          else {
            lVar8 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
          }
          Abc_Print(1,"%s =","Time");
          Abc_Print(1,"%9.2f sec\n",(double)(lVar8 + lVar5) / 1000000.0);
          uVar7 = uVar6;
          if ((int)uVar2 <= (int)uVar6) {
            uVar7 = uVar2;
          }
          if ((int)uVar2 < (int)uVar6) {
            pvVar4 = local_40;
          }
          lVar3 = lVar3 + 2;
          __ptr_01 = local_38;
          uVar6 = uVar7;
        } while ((int)lVar3 < local_38->nSize);
      }
      printf("The best settings are: %20s    \n",pvVar4);
      printf("Best cost = %6d.  ",(ulong)uVar7);
      iVar1 = clock_gettime(3,&local_70);
      vPars = local_48;
      __ptr_00 = local_60;
      if (iVar1 < 0) {
        lVar3 = -1;
      }
      else {
        lVar3 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
      }
      lVar3 = lVar3 + local_50;
      Abc_Print(1,"%s =","Total time");
      Abc_Print(1,"%9.2f sec\n",(double)lVar3 / 1000000.0);
    }
    iVar1 = vPars->nCap;
    __ptr_02 = vPars->pArray;
    if (iVar1 < 1) {
      if (__ptr_02 != (Vec_Int_t *)0x0) goto LAB_00324ed0;
    }
    else {
      lVar3 = 8;
      lVar5 = 0;
      do {
        pvVar4 = *(void **)((long)&__ptr_02->nCap + lVar3);
        if (pvVar4 != (void *)0x0) {
          free(pvVar4);
          __ptr_02 = vPars->pArray;
          *(undefined8 *)((long)&__ptr_02->nCap + lVar3) = 0;
          iVar1 = vPars->nCap;
        }
        lVar5 = lVar5 + 1;
        lVar3 = lVar3 + 0x10;
      } while (lVar5 < iVar1);
LAB_00324ed0:
      free(__ptr_02);
    }
    free(vPars);
    if (__ptr_01 != (Vec_Ptr_t *)0x0) {
      iVar1 = __ptr_01->nSize;
      if (0 < iVar1) {
        lVar3 = 0;
        do {
          if ((void *)0x2 < __ptr_01->pArray[lVar3]) {
            free(__ptr_01->pArray[lVar3]);
            iVar1 = __ptr_01->nSize;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < iVar1);
      }
      if (__ptr_01->pArray != (void **)0x0) {
        free(__ptr_01->pArray);
      }
      free(__ptr_01);
    }
  }
  if (__ptr_00 == (Vec_Ptr_t *)0x0) {
    return;
  }
  iVar1 = __ptr_00->nSize;
  __ptr = __ptr_00->pArray;
  if ((long)iVar1 < 1) {
    if (__ptr == (void **)0x0) goto LAB_00324f5b;
  }
  else {
    lVar3 = 0;
    do {
      Gia_ManStop((Gia_Man_t *)__ptr[lVar3]);
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  free(__ptr);
LAB_00324f5b:
  free(__ptr_00);
  return;
}

Assistant:

void Cmd_RunAutoTuner( char * pConfig, char * pFileList, int nCores )
{
    abctime clk = Abc_Clock();
    Vec_Wec_t * vPars = Cmd_ReadParamChoices( pConfig );
    Vec_Ptr_t * vAigs = Cmd_ReadFiles( pFileList );
    Vec_Ptr_t * vOpts = vPars ? Cmf_CreateOptions( vPars ) : NULL;
    int i; char * pString, * pStringBest = NULL;
    satoko_opts_t * pOpts, * pOptsBest = NULL;
    int Result, ResultBest = 0x7FFFFFFF;
    Gia_Man_t * pGia; 
    // iterate through all possible option settings
    if ( vAigs && vOpts )
    {
        Vec_PtrForEachEntryDouble( satoko_opts_t *, char *, vOpts, pOpts, pString, i )
        {
            abctime clk = Abc_Clock();
            printf( "Evaluating settings: %20s...  \n", pString );
            Result = Cmd_RunAutoTunerEval( vAigs, pOpts, nCores );
            printf( "Cost = %6d.  ", Result );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            if ( ResultBest > Result )
            {
                ResultBest = Result;
                pStringBest = pString;
                pOptsBest = pOpts;
            }
        }
        printf( "The best settings are: %20s    \n", pStringBest );
        printf( "Best cost = %6d.  ", ResultBest );
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    }
    // cleanup
    if ( vPars ) Vec_WecFree( vPars );
    if ( vOpts ) Vec_PtrFreeFree( vOpts );
    if ( vAigs )
    {
        Vec_PtrForEachEntry( Gia_Man_t *, vAigs, pGia, i )
            Gia_ManStop( pGia );
        Vec_PtrFree( vAigs );
    }
}